

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZArc3D>::TPZGeoElRefPattern(TPZGeoElRefPattern<pzgeom::TPZArc3D> *this)

{
  TPZReference *pTVar1;
  
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZArc3D>).super_TPZGeoEl =
       &PTR__TPZSavable_018ad378;
  TPZGeoElRefLess<pzgeom::TPZArc3D>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZArc3D>,&PTR_PTR_018acc50);
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZArc3D>).super_TPZGeoEl =
       &PTR__TPZGeoElRefPattern_018ac950;
  TPZVec<long>::TPZVec(&this->fSubEl,0);
  pTVar1 = (TPZReference *)operator_new(0x10);
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar1->fPointer = (TPZRefPattern *)0x0;
  LOCK();
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fRefPattern).fRef = pTVar1;
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern():TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),
TPZGeoElRefLess<TGeo>(), fSubEl(0), fRefPattern(0)
{
}